

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::testBegin
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint program_id,GLuint vertex
          )

{
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  _variable_type _Var4;
  GLuint GVar5;
  deUint32 dVar6;
  _variable_type _Var7;
  uint uVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  reference pvVar11;
  GLchar *pGVar12;
  GLdouble *pGVar13;
  TestError *pTVar14;
  uniformDVecFunctionPointer p_Var15;
  uniformUVecFunctionPointer p_Var16;
  uniformIVecFunctionPointer p_Var17;
  uniformDMatFunctionPointer p_Var18;
  uniformDMatFunctionPointer p_uniform_function_3;
  uniformIVecFunctionPointer p_uniform_function_2;
  uniformUVecFunctionPointer p_uniform_function_1;
  uniformDVecFunctionPointer p_uniform_function;
  GLdouble *uniform_src;
  GLint uniform_location;
  GLchar *uniform_name;
  GLuint n_columns;
  _variable_type argument_type;
  GLuint argument_offset;
  GLuint argument;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_feedback_buffer_data;
  GLuint vertex_offset;
  GLuint result_buffer_size;
  GLuint n_arguments;
  Functions *gl;
  GLuint arguments_stride;
  GLuint vertex_local;
  GLuint program_id_local;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  long lVar10;
  
  GVar2 = functionObject::getArgumentStride(function_object);
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  _Var4 = (*function_object->_vptr_functionObject[3])();
  GVar5 = functionObject::getResultStride(function_object);
  transform_feedback_buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = GVar2 * vertex;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,(ulong)GVar5);
  (**(code **)(lVar10 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b38);
  pcVar1 = *(code **)(lVar10 + 0x150);
  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  (*pcVar1)(0x8c8e,GVar5,pvVar11,0x88ea);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b3c);
  (**(code **)(lVar10 + 0x50))(0x8c8e,0,this->m_transform_feedback_buffer_id,0,GVar5);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b40);
  (**(code **)(lVar10 + 0xd8))(this->m_vertex_array_object_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b44);
  argument_type = VARIABLE_TYPE_BOOL;
  while( true ) {
    if (_Var4 <= argument_type) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      return;
    }
    GVar2 = functionObject::getArgumentOffset(function_object,argument_type);
    _Var7 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument_type);
    uVar8 = Utils::getNumberOfColumnsForVariableType(_Var7);
    pGVar12 = getUniformName(this,argument_type);
    iVar3 = (**(code **)(lVar10 + 0xb48))(program_id,pGVar12);
    pGVar13 = (GLdouble *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        (&this->m_argument_data,
                         (ulong)(transform_feedback_buffer_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + GVar2));
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"GetUniformLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x3b4f);
    if (iVar3 == -1) break;
    if (uVar8 == 1) {
      _Var7 = Utils::getBaseVariableType(_Var7);
      if (_Var7 == VARIABLE_TYPE_DOUBLE) {
        p_Var15 = getUniformFunctionForDVec(this,argument_type,function_object);
        (*p_Var15)(iVar3,1,pGVar13);
      }
      else if (_Var7 == VARIABLE_TYPE_INT) {
        p_Var17 = getUniformFunctionForIVec(this,argument_type,function_object);
        (*p_Var17)(iVar3,1,(GLint *)pGVar13);
      }
      else {
        if (_Var7 != VARIABLE_TYPE_UINT) {
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,"Not implemented",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0x3b70);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        p_Var16 = getUniformFunctionForUVec(this,argument_type,function_object);
        (*p_Var16)(iVar3,1,(GLuint *)pGVar13);
      }
    }
    else {
      p_Var18 = getUniformFunctionForDMat(this,argument_type,function_object);
      (*p_Var18)(iVar3,1,'\0',pGVar13);
    }
    argument_type = argument_type + VARIABLE_TYPE_BVEC2;
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,"Inactive uniform",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x3b53);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GPUShaderFP64Test10::testBegin(const functionObject& function_object, glw::GLuint program_id, glw::GLuint vertex)
{
	const glw::GLuint	 arguments_stride   = function_object.getArgumentStride();
	const glw::Functions& gl				 = m_context.getRenderContext().getFunctions();
	const glw::GLuint	 n_arguments		 = function_object.getArgumentCount();
	const glw::GLuint	 result_buffer_size = function_object.getResultStride();
	const glw::GLuint	 vertex_offset		 = arguments_stride * vertex;

	/* Update transform feedback buffer */
	std::vector<glw::GLubyte> transform_feedback_buffer_data;
	transform_feedback_buffer_data.resize(result_buffer_size);

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, result_buffer_size, &transform_feedback_buffer_data[0],
				  GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_transform_feedback_buffer_id, 0 /* offset */,
					   result_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	/* Update VAO */
	gl.bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLuint			argument_offset  = function_object.getArgumentOffset(argument);
		const Utils::_variable_type argument_type	= function_object.getArgumentType(argument);
		const glw::GLuint			n_columns		 = Utils::getNumberOfColumnsForVariableType(argument_type);
		const glw::GLchar*			uniform_name	 = getUniformName(argument);
		const glw::GLint			uniform_location = gl.getUniformLocation(program_id, uniform_name);
		const glw::GLdouble*		uniform_src = (glw::GLdouble*)&m_argument_data[vertex_offset + argument_offset];

		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		if (-1 == uniform_location)
		{
			TCU_FAIL("Inactive uniform");
		}

		if (1 == n_columns)
		{
			switch (Utils::getBaseVariableType(argument_type))
			{
			case Utils::VARIABLE_TYPE_DOUBLE:
			{
				uniformDVecFunctionPointer p_uniform_function = getUniformFunctionForDVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, uniform_src);
			}
			break;
			case Utils::VARIABLE_TYPE_UINT:
			{
				uniformUVecFunctionPointer p_uniform_function = getUniformFunctionForUVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, (glw::GLuint*)uniform_src);
			}
			break;
			case Utils::VARIABLE_TYPE_INT:
			{
				uniformIVecFunctionPointer p_uniform_function = getUniformFunctionForIVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, (glw::GLint*)uniform_src);
			}
			break;
			default:
				TCU_FAIL("Not implemented");
				break;
			}
		}
		else
		{
			uniformDMatFunctionPointer p_uniform_function = getUniformFunctionForDMat(argument, function_object);

			p_uniform_function(uniform_location, 1 /* count */, GL_FALSE /* transpose */, uniform_src);
		}
	}
}